

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

void __thiscall
llvm::yaml::IO::enumFallback<llvm::yaml::Hex8,llvm::dwarf::UnitType>(IO *this,UnitType *Val)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  EmptyContext Context;
  Hex8 Res;
  
  uStack_28 = in_RAX;
  iVar1 = (*this->_vptr_IO[0x16])();
  if ((char)iVar1 != '\0') {
    uStack_28._7_1_ = *Val;
    yamlize<llvm::yaml::Hex8>
              (this,(Hex8 *)((long)&uStack_28 + 7),true,(EmptyContext *)((long)&uStack_28 + 6));
    *Val = uStack_28._7_1_;
  }
  return;
}

Assistant:

void enumFallback(T &Val) {
    if (matchEnumFallback()) {
      EmptyContext Context;
      // FIXME: Force integral conversion to allow strong typedefs to convert.
      FBT Res = static_cast<typename FBT::BaseType>(Val);
      yamlize(*this, Res, true, Context);
      Val = static_cast<T>(static_cast<typename FBT::BaseType>(Res));
    }
  }